

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *args_1;
  StatementSyntax *args_3;
  ProceduralBlockSyntax *pPVar1;
  Token local_30;
  
  args_1 = deepClone<slang::syntax::AttributeInstanceSyntax>
                     ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(__fn + 0x18),
                      (BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x50),(BumpAllocator *)__child_stack);
  args_3 = (StatementSyntax *)
           deepClone(*(SyntaxNode **)(__fn + 0x60),(BumpAllocator *)__child_stack);
  pPVar1 = BumpAllocator::
           emplace<slang::syntax::ProceduralBlockSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::StatementSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,args_1,&local_30,args_3);
  return (int)pPVar1;
}

Assistant:

static SyntaxNode* clone(const ProceduralBlockSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<ProceduralBlockSyntax>(
        node.kind,
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone<StatementSyntax>(*node.statement, alloc)
    );
}